

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::builtin_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,BuiltIn builtin,StorageClass storage)

{
  bool bVar1;
  SPIREntryPoint *pSVar2;
  char *pcVar3;
  CompilerError *pCVar4;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  string local_4e8;
  allocator local_4c6;
  allocator local_4c5;
  allocator local_4c4;
  allocator local_4c3;
  allocator local_4c2;
  allocator local_4c1;
  string local_4c0;
  allocator local_49a;
  allocator local_499;
  string local_498;
  allocator local_472;
  allocator local_471;
  string local_470;
  allocator local_44a;
  allocator local_449;
  string local_448;
  allocator local_422;
  allocator local_421;
  string local_420;
  allocator local_3fa;
  allocator local_3f9;
  string local_3f8;
  allocator local_3d2;
  allocator local_3d1;
  string local_3d0;
  allocator local_3aa;
  allocator local_3a9;
  string local_3a8;
  allocator local_382;
  allocator local_381;
  string local_380;
  allocator local_35b;
  allocator local_35a;
  allocator local_359;
  allocator local_358;
  allocator local_357;
  allocator local_356;
  allocator local_355;
  allocator local_354;
  allocator local_353;
  allocator local_352;
  allocator local_351;
  allocator local_350;
  allocator local_34f;
  allocator local_34e;
  allocator local_34d;
  allocator local_34c;
  allocator local_34b;
  allocator local_34a;
  allocator local_349;
  allocator local_348;
  allocator local_347;
  allocator local_346;
  allocator local_345;
  allocator local_344;
  allocator local_343;
  allocator local_342;
  allocator local_341;
  string local_340;
  allocator local_319;
  string local_318;
  allocator local_2f3;
  allocator local_2f2;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a2;
  allocator local_2a1;
  string local_2a0;
  allocator local_279;
  string local_278;
  allocator local_252;
  allocator local_251;
  string local_250;
  allocator local_22b;
  allocator local_22a;
  allocator local_229;
  string local_228;
  allocator local_202;
  allocator local_201;
  string local_200;
  allocator local_1db;
  allocator local_1da;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b2;
  allocator local_1b1;
  string local_1b0;
  allocator local_18b;
  allocator local_18a;
  allocator local_189;
  string local_188;
  allocator local_162;
  allocator local_161;
  allocator local_160;
  allocator local_15f;
  allocator local_15e;
  allocator local_15d;
  allocator local_15c;
  allocator local_15b;
  allocator local_15a;
  allocator local_159;
  allocator local_158;
  allocator local_157;
  allocator local_156;
  allocator local_155;
  allocator local_154;
  allocator local_153;
  allocator local_152;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  ExecutionModel local_104;
  allocator local_fe;
  allocator local_fd;
  ExecutionModel model_1;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_ad;
  allocator local_ac;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  ExecutionModel local_88;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  ExecutionModel model;
  allocator local_5a;
  allocator local_59;
  string local_58;
  allocator local_35 [20];
  allocator local_21;
  StorageClass local_20;
  BuiltIn local_1c;
  StorageClass storage_local;
  BuiltIn builtin_local;
  CompilerGLSL *this_local;
  
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_0000000c,storage);
  local_20 = storage;
  local_1c = builtin;
  _storage_local = this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  if (builtin == BuiltInPosition) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_Position",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else if (builtin == BuiltInPointSize) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_PointSize",local_35);
    ::std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  else if (builtin == BuiltInClipDistance) {
    if (((this->options).es & 1U) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_58,"GL_EXT_clip_cull_distance",&local_59);
      require_extension_internal(this,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_ClipDistance",&local_5a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5a);
  }
  else if (builtin == BuiltInCullDistance) {
    if (((this->options).es & 1U) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&model,"GL_EXT_clip_cull_distance",&local_81);
      require_extension_internal(this,(string *)&model);
      ::std::__cxx11::string::~string((string *)&model);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_CullDistance",&local_82);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_82);
  }
  else if (builtin == BuiltInVertexId) {
    if (((this->options).vulkan_semantics & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,
                 "Cannot implement gl_VertexID in Vulkan GLSL. This shader was created with GL semantics."
                );
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_VertexID",&local_83);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_83);
  }
  else if (builtin == BuiltInInstanceId) {
    if (((this->options).vulkan_semantics & 1U) != 0) {
      pSVar2 = Compiler::get_entry_point(&this->super_Compiler);
      local_88 = pSVar2->model;
      if (2 < local_88 - ExecutionModelIntersectionKHR) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar4,
                   "Cannot implement gl_InstanceID in Vulkan GLSL. This shader was created with GL semantics."
                  );
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x8c)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_a8,"GL_ARB_draw_instanced",&local_a9);
      require_extension_internal(this,&local_a8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_InstanceID",&local_aa);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_aa);
  }
  else if (builtin == BuiltInPrimitiveId) {
    if ((storage == Input) &&
       (pSVar2 = Compiler::get_entry_point(&this->super_Compiler),
       pSVar2->model == ExecutionModelGeometry)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"gl_PrimitiveIDIn",(allocator *)&model_1);
      ::std::allocator<char>::~allocator((allocator<char> *)&model_1);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_PrimitiveID",&local_fd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd);
    }
  }
  else if (builtin == BuiltInInvocationId) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_InvocationID",&local_fe);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_fe);
  }
  else if (builtin == BuiltInLayer) {
    local_104 = Compiler::get_execution_model(&this->super_Compiler);
    if ((local_104 == ExecutionModelVertex) || (local_104 == ExecutionModelTessellationEvaluation))
    {
      if (((this->options).es & 1U) == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_150,"GL_ARB_shader_viewport_layer_array",&local_151);
        require_extension_internal(this,&local_150);
        ::std::__cxx11::string::~string((string *)&local_150);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_151);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_128,"GL_NV_viewport_array2",&local_129);
        require_extension_internal(this,&local_128);
        ::std::__cxx11::string::~string((string *)&local_128);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_129);
      }
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_Layer",&local_152);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_152);
  }
  else if (builtin == BuiltInViewportIndex) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_ViewportIndex",&local_153);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_153);
  }
  else if (builtin == BuiltInTessLevelOuter) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_TessLevelOuter",&local_154);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_154);
  }
  else if (builtin == BuiltInTessLevelInner) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_TessLevelInner",&local_155);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_155);
  }
  else if (builtin == BuiltInTessCoord) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_TessCoord",&local_156);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_156);
  }
  else if (builtin == BuiltInPatchVertices) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_PatchVerticesIn",&local_157)
    ;
    ::std::allocator<char>::~allocator((allocator<char> *)&local_157);
  }
  else if (builtin == BuiltInFragCoord) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_FragCoord",&local_158);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_158);
  }
  else if (builtin == BuiltInPointCoord) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_PointCoord",&local_159);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  else if (builtin == BuiltInFrontFacing) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_FrontFacing",&local_15a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15a);
  }
  else if (builtin == BuiltInSampleId) {
    bVar1 = is_legacy(this);
    if (bVar1) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Sample variables not supported in legacy GLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) || (0x13f < (this->options).version)) {
      if ((((this->options).es & 1U) == 0) && ((this->options).version < 400)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_2a0,"GL_ARB_sample_shading",&local_2a1);
        require_extension_internal(this,&local_2a0);
        ::std::__cxx11::string::~string((string *)&local_2a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_278,"GL_OES_sample_variables",&local_279);
      require_extension_internal(this,&local_278);
      ::std::__cxx11::string::~string((string *)&local_278);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_279);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SampleID",&local_2a2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2a2);
  }
  else if (builtin == BuiltInSamplePosition) {
    bVar1 = is_legacy(this);
    if (bVar1) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Sample variables not supported in legacy GLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) || (0x13f < (this->options).version)) {
      if ((((this->options).es & 1U) == 0) && ((this->options).version < 400)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_340,"GL_ARB_sample_shading",&local_341);
        require_extension_internal(this,&local_340);
        ::std::__cxx11::string::~string((string *)&local_340);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_341);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_318,"GL_OES_sample_variables",&local_319);
      require_extension_internal(this,&local_318);
      ::std::__cxx11::string::~string((string *)&local_318);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_319);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SamplePosition",&local_342);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_342);
  }
  else if (builtin == BuiltInSampleMask) {
    bVar1 = is_legacy(this);
    if (bVar1) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Sample variables not supported in legacy GLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) || (0x13f < (this->options).version)) {
      if ((((this->options).es & 1U) == 0) && ((this->options).version < 400)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_2f0,"GL_ARB_sample_shading",&local_2f1);
        require_extension_internal(this,&local_2f0);
        ::std::__cxx11::string::~string((string *)&local_2f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_2c8,"GL_OES_sample_variables",&local_2c9);
      require_extension_internal(this,&local_2c8);
      ::std::__cxx11::string::~string((string *)&local_2c8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    }
    if (local_20 == Input) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SampleMaskIn",&local_2f2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f2);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SampleMask",&local_2f3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f3);
    }
  }
  else if (builtin == BuiltInFragDepth) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_FragDepth",&local_15b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15b);
  }
  else if (builtin == BuiltInHelperInvocation) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_HelperInvocation",&local_162);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_162);
  }
  else if (builtin == BuiltInNumWorkgroups) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_NumWorkGroups",&local_15c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15c);
  }
  else if (builtin == BuiltInWorkgroupSize) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_WorkGroupSize",&local_15d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15d);
  }
  else if (builtin == BuiltInWorkgroupId) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_WorkGroupID",&local_15e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15e);
  }
  else if (builtin == BuiltInLocalInvocationId) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_LocalInvocationID",&local_15f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15f);
  }
  else if (builtin == BuiltInGlobalInvocationId) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_GlobalInvocationID",&local_160);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_160);
  }
  else if (builtin == BuiltInLocalInvocationIndex) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_LocalInvocationIndex",&local_161);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_161);
  }
  else if (builtin == BuiltInSubgroupSize) {
    request_subgroup_feature(this,SubgroupSize);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupSize",&local_347);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_347);
  }
  else if (builtin == BuiltInNumSubgroups) {
    request_subgroup_feature(this,NumSubgroups);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_NumSubgroups",&local_345);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_345);
  }
  else if (builtin == BuiltInSubgroupId) {
    request_subgroup_feature(this,SubgroupID);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupID",&local_346);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_346);
  }
  else if (builtin == BuiltInSubgroupLocalInvocationId) {
    request_subgroup_feature(this,SubgroupInvocationID);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_SubgroupInvocationID",&local_348);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_348);
  }
  else if (builtin == BuiltInVertexIndex) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_VertexID",&local_ac);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ac);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_VertexIndex",&local_ab);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ab);
    }
  }
  else if (builtin == BuiltInInstanceIndex) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x8c)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_d0,"GL_ARB_draw_instanced",&local_d1);
        require_extension_internal(this,&local_d0);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      }
      if (((this->options).vertex.support_nonzero_base_instance & 1U) == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"gl_InstanceID",
                   (allocator *)((long)&model_1 + 1));
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&model_1 + 1));
      }
      else {
        if (((this->options).vulkan_semantics & 1U) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_f8,"GL_ARB_shader_draw_parameters",
                     (allocator *)((long)&model_1 + 3));
          require_extension_internal(this,&local_f8);
          ::std::__cxx11::string::~string((string *)&local_f8);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&model_1 + 3));
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"(gl_InstanceID + SPIRV_Cross_BaseInstance)",
                   (allocator *)((long)&model_1 + 2));
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&model_1 + 2));
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_InstanceIndex",&local_ad);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ad);
    }
  }
  else if (builtin == BuiltInSubgroupEqMask) {
    request_subgroup_feature(this,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupEqMask",&local_349);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_349);
  }
  else if (builtin == BuiltInSubgroupGeMask) {
    request_subgroup_feature(this,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupGeMask",&local_34a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_34a);
  }
  else if (builtin == BuiltInSubgroupGtMask) {
    request_subgroup_feature(this,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupGtMask",&local_34b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_34b);
  }
  else if (builtin == BuiltInSubgroupLeMask) {
    request_subgroup_feature(this,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupLeMask",&local_34c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_34c);
  }
  else if (builtin == BuiltInSubgroupLtMask) {
    request_subgroup_feature(this,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupLtMask",&local_34d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_34d);
  }
  else if (builtin == BaseVertex) {
    if (((this->options).es & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"BaseVertex not supported in ES profile.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_1b0,"GL_ARB_shader_draw_parameters",&local_1b1);
      require_extension_internal(this,&local_1b0);
      ::std::__cxx11::string::~string((string *)&local_1b0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"SPIRV_Cross_BaseVertex",&local_1b2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1b2);
    }
    else if ((this->options).version < 0x1cc) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_188,"GL_ARB_shader_draw_parameters",&local_189);
      require_extension_internal(this,&local_188);
      ::std::__cxx11::string::~string((string *)&local_188);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_189);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_BaseVertexARB",&local_18a)
      ;
      ::std::allocator<char>::~allocator((allocator<char> *)&local_18a);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_BaseVertex",&local_18b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_18b);
    }
  }
  else if (builtin == BaseInstance) {
    if (((this->options).es & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"BaseInstance not supported in ES profile.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_200,"GL_ARB_shader_draw_parameters",&local_201);
      require_extension_internal(this,&local_200);
      ::std::__cxx11::string::~string((string *)&local_200);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_201);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"SPIRV_Cross_BaseInstance",&local_202);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_202);
    }
    else if ((this->options).version < 0x1cc) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_1d8,"GL_ARB_shader_draw_parameters",&local_1d9);
      require_extension_internal(this,&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"gl_BaseInstanceARB",&local_1da);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1da);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_BaseInstance",&local_1db);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1db);
    }
  }
  else if (builtin == BuiltInDrawIndex) {
    if (((this->options).es & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"DrawIndex not supported in ES profile.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_250,"GL_ARB_shader_draw_parameters",&local_251);
      require_extension_internal(this,&local_250);
      ::std::__cxx11::string::~string((string *)&local_250);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_251);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_DrawIDARB",&local_252);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_252);
    }
    else if ((this->options).version < 0x1cc) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_228,"GL_ARB_shader_draw_parameters",&local_229);
      require_extension_internal(this,&local_228);
      ::std::__cxx11::string::~string((string *)&local_228);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_229);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_DrawIDARB",&local_22a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_22a);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_DrawID",&local_22b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_22b);
    }
  }
  else if (builtin == BuiltInPrimitiveShadingRateKHR) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Can only use PrimitiveShadingRateKHR in Vulkan GLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_448,"GL_EXT_fragment_shading_rate",&local_449);
    require_extension_internal(this,&local_448);
    ::std::__cxx11::string::~string((string *)&local_448);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_449);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_PrimitiveShadingRateEXT",&local_44a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_44a);
  }
  else if (builtin == BuiltInDeviceIndex) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Need Vulkan semantics for device group support.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_498,"GL_EXT_device_group",&local_499);
    require_extension_internal(this,&local_498);
    ::std::__cxx11::string::~string((string *)&local_498);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_499);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_DeviceIndex",&local_49a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_49a);
  }
  else if (builtin == BuiltInViewIndex) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_ViewID_OVR",&local_344);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_344);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_ViewIndex",&local_343);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_343);
    }
  }
  else if (builtin == BuiltInShadingRateKHR) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Can only use ShadingRateKHR in Vulkan GLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_470,"GL_EXT_fragment_shading_rate",&local_471);
    require_extension_internal(this,&local_470);
    ::std::__cxx11::string::~string((string *)&local_470);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_471);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_ShadingRateEXT",&local_472);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_472);
  }
  else if (builtin == BuiltInFragStencilRefEXT) {
    if (((this->options).es & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Stencil export not supported in GLES.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_420,"GL_ARB_shader_stencil_export",&local_421);
    require_extension_internal(this,&local_420);
    ::std::__cxx11::string::~string((string *)&local_420);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_421);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_FragStencilRefARB",&local_422);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_422);
  }
  else if (builtin == BuiltInFullyCoveredEXT) {
    if (((this->options).es & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"Need desktop GL to use GL_NV_conservative_raster_underestimation.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_4c0,"GL_NV_conservative_raster_underestimation",&local_4c1);
    require_extension_internal(this,&local_4c0);
    ::std::__cxx11::string::~string((string *)&local_4c0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_FragFullyCoveredNV",&local_4c2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4c2);
  }
  else if (builtin == BaryCoordKHR) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"gl_BaryCoordEXT requires ESSL 320.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1c2)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"gl_BaryCoordEXT requires GLSL 450.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((this->barycentric_is_nv & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_3a8,"GL_EXT_fragment_shader_barycentric",&local_3a9);
      require_extension_internal(this,&local_3a8);
      ::std::__cxx11::string::~string((string *)&local_3a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_BaryCoordEXT",&local_3aa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3aa);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_380,"GL_NV_fragment_shader_barycentric",&local_381);
      require_extension_internal(this,&local_380);
      ::std::__cxx11::string::~string((string *)&local_380);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_BaryCoordNV",&local_382);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_382);
    }
  }
  else if (builtin == BaryCoordNoPerspKHR) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"gl_BaryCoordNoPerspEXT requires ESSL 320.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1c2)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"gl_BaryCoordNoPerspEXT requires GLSL 450.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((this->barycentric_is_nv & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_3f8,"GL_EXT_fragment_shader_barycentric",&local_3f9);
      require_extension_internal(this,&local_3f8);
      ::std::__cxx11::string::~string((string *)&local_3f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"gl_BaryCoordNoPerspEXT",&local_3fa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3fa);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_3d0,"GL_NV_fragment_shader_barycentric",&local_3d1);
      require_extension_internal(this,&local_3d0);
      ::std::__cxx11::string::~string((string *)&local_3d0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"gl_BaryCoordNoPerspNV",&local_3d2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3d2);
    }
  }
  else if (builtin == BuiltInPrimitivePointIndicesEXT) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_PrimitivePointIndicesEXT",&local_4c5);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4c5);
  }
  else if (builtin == BuiltInPrimitiveLineIndicesEXT) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_PrimitiveLineIndicesEXT",&local_4c4);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4c4);
  }
  else if (builtin == BuiltInPrimitiveTriangleIndicesEXT) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_PrimitiveTriangleIndicesEXT",&local_4c3);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4c3);
  }
  else if (builtin == BuiltInCullPrimitiveEXT) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_CullPrimitiveEXT",&local_4c6);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4c6);
  }
  else if (builtin == BuiltInLaunchIdKHR) {
    pcVar3 = "gl_LaunchIDNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_LaunchIDEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_34e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_34e);
  }
  else if (builtin == BuiltInLaunchSizeKHR) {
    pcVar3 = "gl_LaunchSizeNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_LaunchSizeEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_34f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_34f);
  }
  else if (builtin == BuiltInWorldRayOriginKHR) {
    pcVar3 = "gl_WorldRayOriginNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_WorldRayOriginEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_350);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_350);
  }
  else if (builtin == BuiltInWorldRayDirectionKHR) {
    pcVar3 = "gl_WorldRayDirectionNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_WorldRayDirectionEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_351);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_351);
  }
  else if (builtin == BuiltInObjectRayOriginKHR) {
    pcVar3 = "gl_ObjectRayOriginNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_ObjectRayOriginEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_352);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_352);
  }
  else if (builtin == BuiltInObjectRayDirectionKHR) {
    pcVar3 = "gl_ObjectRayDirectionNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_ObjectRayDirectionEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_353);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_353);
  }
  else if (builtin == BuiltInRayTminKHR) {
    pcVar3 = "gl_RayTminNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_RayTminEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_354);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_354);
  }
  else if (builtin == BuiltInRayTmaxKHR) {
    pcVar3 = "gl_RayTmaxNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_RayTmaxEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_355);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_355);
  }
  else if (builtin == BuiltInInstanceCustomIndexKHR) {
    pcVar3 = "gl_InstanceCustomIndexNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_InstanceCustomIndexEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_356);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_356);
  }
  else if (builtin == BuiltInObjectToWorldKHR) {
    pcVar3 = "gl_ObjectToWorldNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_ObjectToWorldEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_357);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_357);
  }
  else if (builtin == BuiltInWorldToObjectKHR) {
    pcVar3 = "gl_WorldToObjectNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_WorldToObjectEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_358);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_358);
  }
  else if (builtin == BuiltInHitTNV) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_HitTNV",&local_359);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_359);
  }
  else if (builtin == BuiltInHitKindKHR) {
    pcVar3 = "gl_HitKindNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_HitKindEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_35a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_35a);
  }
  else if (builtin == BuiltInIncomingRayFlagsKHR) {
    pcVar3 = "gl_IncomingRayFlagsNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_IncomingRayFlagsEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_35b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_35b);
  }
  else {
    convert_to_string<spv::BuiltIn,_0>(&local_4e8,&local_1c);
    join<char_const(&)[12],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)"gl_BuiltIn_",(char (*) [12])&local_4e8,ts_1);
    ::std::__cxx11::string::~string((string *)&local_4e8);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::builtin_to_glsl(BuiltIn builtin, StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInPosition:
		return "gl_Position";
	case BuiltInPointSize:
		return "gl_PointSize";
	case BuiltInClipDistance:
	{
		if (options.es)
			require_extension_internal("GL_EXT_clip_cull_distance");
		return "gl_ClipDistance";
	}
	case BuiltInCullDistance:
	{
		if (options.es)
			require_extension_internal("GL_EXT_clip_cull_distance");
		return "gl_CullDistance";
	}
	case BuiltInVertexId:
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot implement gl_VertexID in Vulkan GLSL. This shader was created "
			                  "with GL semantics.");
		return "gl_VertexID";
	case BuiltInInstanceId:
		if (options.vulkan_semantics)
		{
			auto model = get_entry_point().model;
			switch (model)
			{
			case spv::ExecutionModelIntersectionKHR:
			case spv::ExecutionModelAnyHitKHR:
			case spv::ExecutionModelClosestHitKHR:
				// gl_InstanceID is allowed in these shaders.
				break;

			default:
				SPIRV_CROSS_THROW("Cannot implement gl_InstanceID in Vulkan GLSL. This shader was "
				                  "created with GL semantics.");
			}
		}
		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}
		return "gl_InstanceID";
	case BuiltInVertexIndex:
		if (options.vulkan_semantics)
			return "gl_VertexIndex";
		else
			return "gl_VertexID"; // gl_VertexID already has the base offset applied.
	case BuiltInInstanceIndex:
		if (options.vulkan_semantics)
			return "gl_InstanceIndex";

		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}

		if (options.vertex.support_nonzero_base_instance)
		{
			if (!options.vulkan_semantics)
			{
				// This is a soft-enable. We will opt-in to using gl_BaseInstanceARB if supported.
				require_extension_internal("GL_ARB_shader_draw_parameters");
			}
			return "(gl_InstanceID + SPIRV_Cross_BaseInstance)"; // ... but not gl_InstanceID.
		}
		else
			return "gl_InstanceID";
	case BuiltInPrimitiveId:
		if (storage == StorageClassInput && get_entry_point().model == ExecutionModelGeometry)
			return "gl_PrimitiveIDIn";
		else
			return "gl_PrimitiveID";
	case BuiltInInvocationId:
		return "gl_InvocationID";
	case BuiltInLayer:
	{
		auto model = get_execution_model();
		if (model == ExecutionModelVertex || model == ExecutionModelTessellationEvaluation)
		{
			if (options.es)
				require_extension_internal("GL_NV_viewport_array2");
			else
				require_extension_internal("GL_ARB_shader_viewport_layer_array");
		}
		return "gl_Layer";
	}
	case BuiltInViewportIndex:
		return "gl_ViewportIndex";
	case BuiltInTessLevelOuter:
		return "gl_TessLevelOuter";
	case BuiltInTessLevelInner:
		return "gl_TessLevelInner";
	case BuiltInTessCoord:
		return "gl_TessCoord";
	case BuiltInPatchVertices:
		return "gl_PatchVerticesIn";
	case BuiltInFragCoord:
		return "gl_FragCoord";
	case BuiltInPointCoord:
		return "gl_PointCoord";
	case BuiltInFrontFacing:
		return "gl_FrontFacing";
	case BuiltInFragDepth:
		return "gl_FragDepth";
	case BuiltInNumWorkgroups:
		return "gl_NumWorkGroups";
	case BuiltInWorkgroupSize:
		return "gl_WorkGroupSize";
	case BuiltInWorkgroupId:
		return "gl_WorkGroupID";
	case BuiltInLocalInvocationId:
		return "gl_LocalInvocationID";
	case BuiltInGlobalInvocationId:
		return "gl_GlobalInvocationID";
	case BuiltInLocalInvocationIndex:
		return "gl_LocalInvocationIndex";
	case BuiltInHelperInvocation:
		return "gl_HelperInvocation";

	case BuiltInBaseVertex:
		if (options.es)
			SPIRV_CROSS_THROW("BaseVertex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseVertexARB";
			}
			return "gl_BaseVertex";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseVertex";

	case BuiltInBaseInstance:
		if (options.es)
			SPIRV_CROSS_THROW("BaseInstance not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseInstanceARB";
			}
			return "gl_BaseInstance";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseInstance";

	case BuiltInDrawIndex:
		if (options.es)
			SPIRV_CROSS_THROW("DrawIndex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_DrawIDARB";
			}
			return "gl_DrawID";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "gl_DrawIDARB";

	case BuiltInSampleId:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");
		return "gl_SampleID";

	case BuiltInSampleMask:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");

		if (storage == StorageClassInput)
			return "gl_SampleMaskIn";
		else
			return "gl_SampleMask";

	case BuiltInSamplePosition:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");
		return "gl_SamplePosition";

	case BuiltInViewIndex:
		if (options.vulkan_semantics)
			return "gl_ViewIndex";
		else
			return "gl_ViewID_OVR";

	case BuiltInNumSubgroups:
		request_subgroup_feature(ShaderSubgroupSupportHelper::NumSubgroups);
		return "gl_NumSubgroups";

	case BuiltInSubgroupId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupID);
		return "gl_SubgroupID";

	case BuiltInSubgroupSize:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupSize);
		return "gl_SubgroupSize";

	case BuiltInSubgroupLocalInvocationId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInvocationID);
		return "gl_SubgroupInvocationID";

	case BuiltInSubgroupEqMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupEqMask";

	case BuiltInSubgroupGeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGeMask";

	case BuiltInSubgroupGtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGtMask";

	case BuiltInSubgroupLeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLeMask";

	case BuiltInSubgroupLtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLtMask";

	case BuiltInLaunchIdKHR:
		return ray_tracing_is_khr ? "gl_LaunchIDEXT" : "gl_LaunchIDNV";
	case BuiltInLaunchSizeKHR:
		return ray_tracing_is_khr ? "gl_LaunchSizeEXT" : "gl_LaunchSizeNV";
	case BuiltInWorldRayOriginKHR:
		return ray_tracing_is_khr ? "gl_WorldRayOriginEXT" : "gl_WorldRayOriginNV";
	case BuiltInWorldRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_WorldRayDirectionEXT" : "gl_WorldRayDirectionNV";
	case BuiltInObjectRayOriginKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayOriginEXT" : "gl_ObjectRayOriginNV";
	case BuiltInObjectRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayDirectionEXT" : "gl_ObjectRayDirectionNV";
	case BuiltInRayTminKHR:
		return ray_tracing_is_khr ? "gl_RayTminEXT" : "gl_RayTminNV";
	case BuiltInRayTmaxKHR:
		return ray_tracing_is_khr ? "gl_RayTmaxEXT" : "gl_RayTmaxNV";
	case BuiltInInstanceCustomIndexKHR:
		return ray_tracing_is_khr ? "gl_InstanceCustomIndexEXT" : "gl_InstanceCustomIndexNV";
	case BuiltInObjectToWorldKHR:
		return ray_tracing_is_khr ? "gl_ObjectToWorldEXT" : "gl_ObjectToWorldNV";
	case BuiltInWorldToObjectKHR:
		return ray_tracing_is_khr ? "gl_WorldToObjectEXT" : "gl_WorldToObjectNV";
	case BuiltInHitTNV:
		// gl_HitTEXT is an alias of RayTMax in KHR.
		return "gl_HitTNV";
	case BuiltInHitKindKHR:
		return ray_tracing_is_khr ? "gl_HitKindEXT" : "gl_HitKindNV";
	case BuiltInIncomingRayFlagsKHR:
		return ray_tracing_is_khr ? "gl_IncomingRayFlagsEXT" : "gl_IncomingRayFlagsNV";

	case BuiltInBaryCoordKHR:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordEXT";
		}
	}

	case BuiltInBaryCoordNoPerspNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspEXT";
		}
	}

	case BuiltInFragStencilRefEXT:
	{
		if (!options.es)
		{
			require_extension_internal("GL_ARB_shader_stencil_export");
			return "gl_FragStencilRefARB";
		}
		else
			SPIRV_CROSS_THROW("Stencil export not supported in GLES.");
	}

	case BuiltInPrimitiveShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use PrimitiveShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_PrimitiveShadingRateEXT";
	}

	case BuiltInShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use ShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_ShadingRateEXT";
	}

	case BuiltInDeviceIndex:
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Need Vulkan semantics for device group support.");
		require_extension_internal("GL_EXT_device_group");
		return "gl_DeviceIndex";

	case BuiltInFullyCoveredEXT:
		if (!options.es)
			require_extension_internal("GL_NV_conservative_raster_underestimation");
		else
			SPIRV_CROSS_THROW("Need desktop GL to use GL_NV_conservative_raster_underestimation.");
		return "gl_FragFullyCoveredNV";

	case BuiltInPrimitiveTriangleIndicesEXT:
		return "gl_PrimitiveTriangleIndicesEXT";
	case BuiltInPrimitiveLineIndicesEXT:
		return "gl_PrimitiveLineIndicesEXT";
	case BuiltInPrimitivePointIndicesEXT:
		return "gl_PrimitivePointIndicesEXT";
	case BuiltInCullPrimitiveEXT:
		return "gl_CullPrimitiveEXT";

	default:
		return join("gl_BuiltIn_", convert_to_string(builtin));
	}
}